

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

string * common::InvalidEstimateModeErrorMessage_abi_cxx11_(void)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string *delimiter;
  allocator<char> local_69;
  allocator<char> *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  delimiter = (string *)&local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  FeeModes(delimiter);
  std::operator+((char *)delimiter,in_RDI);
  std::operator+(delimiter,(char *)in_RDI);
  std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  std::allocator<char>::~allocator(&local_69);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string InvalidEstimateModeErrorMessage()
{
    return "Invalid estimate_mode parameter, must be one of: \"" + FeeModes("\", \"") + "\"";
}